

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringReplaceHelper.cxx
# Opt level: O0

bool __thiscall
cmStringReplaceHelper::Replace(cmStringReplaceHelper *this,string *input,string *output)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  string local_420 [32];
  string local_400 [32];
  ostringstream local_3e0 [8];
  ostringstream error_1;
  string local_268 [32];
  ulong local_248;
  size_type len;
  size_type end;
  size_type start;
  reference pRStack_228;
  int n;
  RegexReplacement *replacement;
  iterator __end2;
  iterator __begin2;
  vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  *__range2;
  ostringstream local_1e8 [8];
  ostringstream error;
  string local_60 [32];
  size_type local_40;
  size_type r;
  size_type l2;
  size_type base;
  string *output_local;
  string *input_local;
  cmStringReplaceHelper *this_local;
  
  base = (size_type)output;
  output_local = input;
  input_local = &this->ErrorString;
  std::__cxx11::string::clear();
  l2 = 0;
  do {
    lVar3 = std::__cxx11::string::c_str();
    bVar2 = cmsys::RegularExpression::find(&this->RegularExpression,(char *)(lVar3 + l2));
    psVar1 = output_local;
    if (!bVar2) {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_420,(ulong)psVar1);
      std::__cxx11::string::operator+=((string *)base,local_420);
      std::__cxx11::string::~string(local_420);
      this_local._7_1_ = 1;
LAB_003cc7a6:
      return (bool)(this_local._7_1_ & 1);
    }
    if (this->Makefile != (cmMakefile *)0x0) {
      cmMakefile::ClearMatches(this->Makefile);
      cmMakefile::StoreMatches(this->Makefile,&this->RegularExpression);
    }
    r = cmsys::RegularExpression::start(&this->RegularExpression);
    local_40 = cmsys::RegularExpression::end(&this->RegularExpression);
    std::__cxx11::string::substr((ulong)local_60,(ulong)output_local);
    std::__cxx11::string::operator+=((string *)base,local_60);
    std::__cxx11::string::~string(local_60);
    if (local_40 == r) {
      std::__cxx11::ostringstream::ostringstream(local_1e8);
      poVar4 = std::operator<<((ostream *)local_1e8,"regex \"");
      poVar4 = std::operator<<(poVar4,(string *)&this->RegExString);
      std::operator<<(poVar4,"\" matched an empty string");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)this,(string *)&__range2);
      std::__cxx11::string::~string((string *)&__range2);
      this_local._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1e8);
      goto LAB_003cc7a6;
    }
    __end2 = std::
             vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
             ::begin(&this->Replacements);
    replacement = (RegexReplacement *)
                  std::
                  vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
                  ::end(&this->Replacements);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<cmStringReplaceHelper::RegexReplacement_*,_std::vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>_>
                                  *)&replacement);
      if (!bVar2) break;
      pRStack_228 = __gnu_cxx::
                    __normal_iterator<cmStringReplaceHelper::RegexReplacement_*,_std::vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>_>
                    ::operator*(&__end2);
      if (pRStack_228->Number < 0) {
        std::__cxx11::string::operator+=((string *)base,(string *)&pRStack_228->Value);
      }
      else {
        start._4_4_ = pRStack_228->Number;
        end = cmsys::RegularExpression::start(&this->RegularExpression,start._4_4_);
        len = cmsys::RegularExpression::end(&this->RegularExpression,start._4_4_);
        lVar3 = std::__cxx11::string::length();
        local_248 = lVar3 - l2;
        if ((((end == 0xffffffffffffffff) || (len == 0xffffffffffffffff)) || (local_248 < end)) ||
           (local_248 < len)) {
          std::__cxx11::ostringstream::ostringstream(local_3e0);
          poVar4 = std::operator<<((ostream *)local_3e0,"replace expression \"");
          poVar4 = std::operator<<(poVar4,(string *)&this->ReplaceExpression);
          poVar4 = std::operator<<(poVar4,"\" contains an out-of-range escape for regex \"");
          poVar4 = std::operator<<(poVar4,(string *)&this->RegExString);
          std::operator<<(poVar4,"\"");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=((string *)this,local_400);
          std::__cxx11::string::~string(local_400);
          this_local._7_1_ = 0;
          std::__cxx11::ostringstream::~ostringstream(local_3e0);
          goto LAB_003cc7a6;
        }
        std::__cxx11::string::substr((ulong)local_268,(ulong)output_local);
        std::__cxx11::string::operator+=((string *)base,local_268);
        std::__cxx11::string::~string(local_268);
      }
      __gnu_cxx::
      __normal_iterator<cmStringReplaceHelper::RegexReplacement_*,_std::vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>_>
      ::operator++(&__end2);
    }
    l2 = local_40 + l2;
  } while( true );
}

Assistant:

bool cmStringReplaceHelper::Replace(const std::string& input,
                                    std::string& output)
{
  output.clear();

  // Scan through the input for all matches.
  std::string::size_type base = 0;
  while (this->RegularExpression.find(input.c_str() + base)) {
    if (this->Makefile != nullptr) {
      this->Makefile->ClearMatches();
      this->Makefile->StoreMatches(this->RegularExpression);
    }
    auto l2 = this->RegularExpression.start();
    auto r = this->RegularExpression.end();

    // Concatenate the part of the input that was not matched.
    output += input.substr(base, l2);

    // Make sure the match had some text.
    if (r - l2 == 0) {
      std::ostringstream error;
      error << "regex \"" << this->RegExString << "\" matched an empty string";
      this->ErrorString = error.str();
      return false;
    }

    // Concatenate the replacement for the match.
    for (const auto& replacement : this->Replacements) {
      if (replacement.Number < 0) {
        // This is just a plain-text part of the replacement.
        output += replacement.Value;
      } else {
        // Replace with part of the match.
        auto n = replacement.Number;
        auto start = this->RegularExpression.start(n);
        auto end = this->RegularExpression.end(n);
        auto len = input.length() - base;
        if ((start != std::string::npos) && (end != std::string::npos) &&
            (start <= len) && (end <= len)) {
          output += input.substr(base + start, end - start);
        } else {
          std::ostringstream error;
          error << "replace expression \"" << this->ReplaceExpression
                << "\" contains an out-of-range escape for regex \""
                << this->RegExString << "\"";
          this->ErrorString = error.str();
          return false;
        }
      }
    }

    // Move past the match.
    base += r;
  }

  // Concatenate the text after the last match.
  output += input.substr(base, input.length() - base);

  return true;
}